

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O1

void __thiscall
leveldb::FilterBlockBuilder::FilterBlockBuilder(FilterBlockBuilder *this,FilterPolicy *policy)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->policy_ = policy;
  (this->keys_)._M_dataplus._M_p = (pointer)&(this->keys_).field_2;
  (this->keys_)._M_string_length = 0;
  (this->keys_).field_2._M_local_buf[0] = '\0';
  (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result_)._M_dataplus._M_p = (pointer)&(this->result_).field_2;
  (this->result_)._M_string_length = 0;
  (this->result_).field_2._M_local_buf[0] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

FilterBlockBuilder::FilterBlockBuilder(const FilterPolicy* policy)
    : policy_(policy) {}